

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QMainWindowTabBar::mouseReleaseEvent(QMainWindowTabBar *this,QMouseEvent *e)

{
  QMainWindowTabBar *pQVar1;
  QDockWidgetPrivate *this_00;
  DragState *pDVar2;
  int *piVar3;
  
  piVar3 = *(int **)(this + 0x30);
  if (((piVar3 != (int *)0x0) && (*(long *)(this + 0x38) != 0 && piVar3[1] != 0)) &&
     (*(int *)(e + 0x40) == 1)) {
    pQVar1 = this + 0x30;
    this_00 = *(QDockWidgetPrivate **)(*(long *)(this + 0x38) + 8);
    pDVar2 = this_00->state;
    if ((pDVar2 == (DragState *)0x0) || (pDVar2->dragging == false)) {
      *(undefined8 *)pQVar1 = 0;
      *(undefined8 *)(this + 0x38) = 0;
    }
    else {
      QDockWidgetPrivate::endDrag(this_00,LocationChange);
      piVar3 = *(int **)pQVar1;
      *(undefined8 *)pQVar1 = 0;
      *(undefined8 *)(this + 0x38) = 0;
      if (piVar3 == (int *)0x0) goto LAB_00433b66;
    }
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
LAB_00433b66:
  QTabBar::mouseReleaseEvent((QTabBar *)this,e);
  return;
}

Assistant:

void QMainWindowTabBar::mouseReleaseEvent(QMouseEvent *e)
{
    if (draggingDock && e->button() == Qt::LeftButton) {
        QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
        if (dockPriv->state && dockPriv->state->dragging)
            dockPriv->endDrag(QDockWidgetPrivate::EndDragMode::LocationChange);

        draggingDock = nullptr;
    }
    QTabBar::mouseReleaseEvent(e);
}